

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon.cpp
# Opt level: O3

void __thiscall QSystemTrayIconPrivate::addPlatformMenu(QSystemTrayIconPrivate *this,QMenu *menu)

{
  QPlatformMenu *pQVar1;
  long lVar2;
  QMenu *menu_00;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  QList<QAction_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QMenu::platformMenu(menu);
  if (pQVar1 == (QPlatformMenu *)0x0) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::actions(&local_58,&menu->super_QWidget);
    if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
      lVar4 = local_58.d.size << 3;
      lVar3 = 0;
      do {
        QAction::menuObject();
        lVar2 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
        if (lVar2 != 0) {
          QAction::menuObject();
          menu_00 = (QMenu *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
          addPlatformMenu(this,menu_00);
        }
        lVar3 = lVar3 + 8;
      } while (lVar4 != lVar3);
    }
    pQVar1 = (QPlatformMenu *)(**(code **)(*(long *)this->qpa_sys + 0xa8))();
    if (pQVar1 != (QPlatformMenu *)0x0) {
      QMenu::setPlatformMenu(menu,pQVar1);
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSystemTrayIconPrivate::addPlatformMenu(QMenu *menu) const
{
#if QT_CONFIG(menu)
    if (menu->platformMenu())
        return; // The platform menu already exists.

    // The recursion depth is the same as menu depth, so should not
    // be higher than 3 levels.
    const auto actions = menu->actions();
    for (QAction *action : actions) {
        if (action->menu())
            addPlatformMenu(action->menu());
    }

    // This menu should be processed *after* its children, otherwise
    // setMenu() is not called on respective QPlatformMenuItems.
    QPlatformMenu *platformMenu = qpa_sys->createMenu();
    if (platformMenu)
        menu->setPlatformMenu(platformMenu);
#else
    Q_UNUSED(menu);
#endif // QT_CONFIG(menu)
}